

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  ostream *poVar1;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream out;
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1e0,this,opt,1);
  ::std::operator<<(local_190,(string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  if (opt->expected_ < 2) {
    if (opt->expected_ < 0) {
      ::std::operator<<(local_190,"...");
    }
  }
  else {
    poVar1 = ::std::operator<<(local_190,"(");
    ::std::__cxx11::to_string(&local_1e0,opt->expected_);
    poVar1 = ::std::operator<<(poVar1,(string *)&local_1e0);
    ::std::operator<<(poVar1,"x)");
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    ::std::operator+(&local_1e0,"[",&local_1c0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&local_1e0,"]");
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);

    if(opt->get_expected() > 1)
        out << "(" << std::to_string(opt->get_expected()) << "x)";
    else if(opt->get_expected() < 0)
        out << "...";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}